

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall re2::DFA::~DFA(DFA *this)

{
  Workq *pWVar1;
  DFA *this_local;
  
  pWVar1 = this->q0_;
  if (pWVar1 != (Workq *)0x0) {
    Workq::~Workq(pWVar1);
    operator_delete(pWVar1);
  }
  pWVar1 = this->q1_;
  if (pWVar1 != (Workq *)0x0) {
    Workq::~Workq(pWVar1);
    operator_delete(pWVar1);
  }
  if (this->astack_ != (int *)0x0) {
    operator_delete__(this->astack_);
  }
  ClearCache(this);
  std::
  unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
  ::~unordered_set(&this->state_cache_);
  Mutex::~Mutex(&this->cache_mutex_);
  Mutex::~Mutex(&this->mutex_);
  return;
}

Assistant:

DFA::~DFA() {
  delete q0_;
  delete q1_;
  delete[] astack_;
  ClearCache();
}